

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::iterate
          (PrimitiveSetInvarianceCase *this)

{
  Vector<float,_3> *v;
  ostringstream *this_00;
  TestLog *pTVar1;
  RenderContext *pRVar2;
  pointer pTVar3;
  pointer pPVar4;
  pointer pVVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  float *outer;
  bool *__lhs;
  long lVar14;
  long lVar15;
  int i;
  long lVar16;
  long lVar17;
  pointer pLVar18;
  deUint32 local_6a4;
  int local_6a0;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> prim0Vertices;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  tessLevelCases;
  Result tfResult;
  RandomViewport viewport;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> firstPrimVertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  float attribute [14];
  string local_578;
  int primCount;
  undefined4 uStack_554;
  pointer piStack_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548 [23];
  string tessLevelsStr;
  VertexArrayBinding bindings [1];
  TFHandler transformFeedback;
  MessageBuilder local_1b0;
  undefined4 extraout_var_00;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar7),0x10,0x10,dVar8);
  iVar7 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar10 = CONCAT44(extraout_var_00,iVar7);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&tessLevelCases,this);
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = -1;
  for (lVar15 = 0;
      lVar15 < (int)((ulong)((long)tessLevelCases.
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)tessLevelCases.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
      lVar15 = lVar15 + 1) {
    _primCount = (pointer)0x0;
    piStack_550 = (pointer)0x0;
    local_548[0]._M_allocated_capacity = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&primitiveCounts,(vector<int,_std::allocator<int>_> *)&primCount);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&primCount);
    lVar14 = 8;
    for (lVar16 = 0;
        pTVar3 = tessLevelCases.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15].levels.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar16 < (int)(((long)tessLevelCases.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].levels.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0x18);
        lVar16 = lVar16 + 1) {
      iVar9 = referencePrimitiveCount
                        (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                         (float *)((long)pTVar3->inner + lVar14 + -8),
                         (float *)((long)pTVar3->inner + lVar14));
      primCount = iVar9;
      std::vector<int,_std::allocator<int>_>::push_back
                (primitiveCounts.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,(value_type_conflict1 *)&primCount)
      ;
      if (iVar7 <= primCount) {
        iVar7 = primCount;
      }
      lVar14 = lVar14 + 0x18;
    }
  }
  if (this->m_usePointMode == true) {
    iVar9 = 1;
    local_6a4 = 0;
  }
  else if (this->m_primitiveType < TESSPRIMITIVETYPE_ISOLINES) {
    iVar9 = 3;
    local_6a4 = 4;
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    iVar9 = 2;
    local_6a4 = 1;
  }
  else {
    iVar9 = -1;
    local_6a4 = 0xffffffff;
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&transformFeedback,((this->super_TestCase).m_context)->m_renderCtx,iVar7 * iVar9 * 2);
  (**(code **)(lVar10 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar10 + 0xfd8))(0x8e72);
  this_00 = &local_1b0.m_str;
  lVar15 = 0;
  do {
    if ((int)((ulong)((long)tessLevelCases.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tessLevelCases.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar15) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_00419a4a:
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler
                (&transformFeedback);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&primitiveCounts);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
      ::~vector(&tessLevelCases);
      return STOP;
    }
    pLVar18 = tessLevelCases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15;
    firstPrimVertices.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tessLevelsStr._M_string_length = 0;
    firstPrimVertices.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    firstPrimVertices.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tessLevelsStr.field_2._M_local_buf[0] = '\0';
    lVar16 = 0;
    lVar14 = 0;
    tessLevelsStr._M_dataplus._M_p = (pointer)&tessLevelsStr.field_2;
    while( true ) {
      pTVar3 = (pLVar18->levels).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(pLVar18->levels).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0x18;
      if ((int)uVar11 <= lVar14) break;
      (anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels::description_abi_cxx11_
                ((string *)&local_1b0,(void *)((long)pTVar3->inner + lVar16));
      __lhs = (bool *)0x7f8998;
      if (uVar11 < 2) {
        __lhs = SSBOArrayLengthTests::init::arraysSized + 1;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&primCount
                     ,__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_1b0);
      std::__cxx11::string::append((string *)&tessLevelsStr);
      std::__cxx11::string::~string((string *)&primCount);
      std::__cxx11::string::~string((string *)&local_1b0);
      lVar14 = lVar14 + 1;
      lVar16 = lVar16 + 0x18;
    }
    _primCount = (pointer)pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&piStack_550);
    std::operator<<((ostream *)&piStack_550,"Tessellation level sets: ");
    std::operator<<((ostream *)&piStack_550,(string *)&tessLevelsStr);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&primCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&piStack_550);
    std::__cxx11::string::~string((string *)&tessLevelsStr);
    lVar14 = 0;
    while (pTVar3 = (pLVar18->levels).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar14 < (int)(((long)(pLVar18->levels).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0x18))
    {
      attribute[0] = pTVar3[lVar14].inner[0];
      attribute[1] = pTVar3[lVar14].inner[1];
      attribute[2] = pTVar3[lVar14].outer[0];
      attribute[3] = pTVar3[lVar14].outer[1];
      attribute[4] = pTVar3[lVar14].outer[2];
      attribute[5] = pTVar3[lVar14].outer[3];
      attribute[6] = 0.0;
      attribute[7] = pTVar3[lVar14].inner[0];
      attribute[8] = pTVar3[lVar14].inner[1];
      attribute[9] = pTVar3[lVar14].outer[0];
      attribute[10] = pTVar3[lVar14].outer[1];
      attribute[0xb] = pTVar3[lVar14].outer[2];
      attribute[0xc] = pTVar3[lVar14].outer[3];
      attribute[0xd] = 0.5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&primCount,"in_v_attr",(allocator<char> *)&tessLevelsStr);
      glu::va::Float(bindings,(string *)&primCount,1,0xe,0,attribute);
      std::__cxx11::string::~string((string *)&primCount);
      lVar16 = 0;
      while( true ) {
        pPVar4 = (this->m_programs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = (long)(this->m_programs).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4;
        lVar13 = (long)(int)(lVar12 / 0x18);
        if (lVar13 <= lVar16) break;
        dVar8 = ((pPVar4[lVar16].program.m_ptr)->m_program).m_program;
        (**(code **)(lVar10 + 0x1680))(dVar8,0x18,lVar12 % 0x18);
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                  (&tfResult,&transformFeedback,dVar8,local_6a4,1,bindings,0xe);
        if (tfResult.numPrimitives !=
            primitiveCounts.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar15].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar14] * 2) {
          _primCount = (pointer)pTVar1;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&piStack_550);
          std::operator<<((ostream *)&piStack_550,
                          "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ");
          std::ostream::operator<<((ostringstream *)&piStack_550,tfResult.numPrimitives);
          std::operator<<((ostream *)&piStack_550,", reference value is ");
          std::ostream::operator<<
                    ((ostringstream *)&piStack_550,
                     primitiveCounts.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar15].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar14] * 2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&primCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&piStack_550);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of primitives");
LAB_0041981c:
          std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
          ~_Vector_base(&tfResult.varying.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       );
          break;
        }
        uVar11 = ((long)tfResult.varying.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)tfResult.varying.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc;
        iVar7 = (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / 2);
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        vector<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,void>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                   &prim0Vertices,
                   (__normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                    )tfResult.varying.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   tfResult.varying.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar7,(allocator_type *)&primCount);
        pVVar5 = tfResult.varying.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar17 = 0;
        for (lVar12 = 0; outer = (float *)0xc,
            lVar12 < (int)(((long)prim0Vertices.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)prim0Vertices.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
            lVar12 = lVar12 + 1) {
          v = (Vector<float,_3> *)((long)pVVar5[iVar7].m_data + lVar17);
          bVar6 = tcu::Vector<float,_3>::operator!=
                            ((Vector<float,_3> *)
                             ((long)(prim0Vertices.
                                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),v)
          ;
          if (bVar6) {
            local_1b0.m_log = pTVar1;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
            std::operator<<((ostream *)this_00,"Failure: tessellation coordinate at index ");
            std::ostream::operator<<(this_00,(int)lVar12);
            std::operator<<((ostream *)this_00,
                            " differs between two primitives drawn in one draw call");
            tessLevelsStr._M_dataplus._M_p =
                 (pointer)tcu::MessageBuilder::operator<<
                                    (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)&tessLevelsStr._M_string_length);
            std::operator<<((ostream *)&tessLevelsStr._M_string_length,"Note: the coordinate is ");
            tcu::operator<<((ostream *)&tessLevelsStr._M_string_length,
                            (Vector<float,_3> *)
                            ((long)(prim0Vertices.
                                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17));
            std::operator<<((ostream *)&tessLevelsStr._M_string_length,
                            " for the first primitive and ");
            tcu::operator<<((ostream *)&tessLevelsStr._M_string_length,v);
            std::operator<<((ostream *)&tessLevelsStr._M_string_length," for the second");
            _primCount = (pointer)tcu::MessageBuilder::operator<<
                                            ((MessageBuilder *)&tessLevelsStr,
                                             (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&piStack_550);
            std::operator<<((ostream *)&piStack_550,
                            "Note: tessellation levels for both primitives were: ");
            (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                      (&local_578,(_anonymous_namespace_ *)(pTVar3 + lVar14),pTVar3[lVar14].outer,
                       outer);
            std::operator<<((ostream *)&piStack_550,(string *)&local_578);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&primCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_578);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&piStack_550);
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)&tessLevelsStr._M_string_length);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of primitives");
            goto LAB_00419812;
          }
          lVar17 = lVar17 + 0xc;
        }
        local_6a0 = (int)lVar14;
        if ((int)lVar16 == 0 && local_6a0 == 0) {
          std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator=
                    (&firstPrimVertices,&prim0Vertices);
        }
        else {
          iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                            (this,&firstPrimVertices,&prim0Vertices,(ulong)(uint)pLVar18->mem);
          if ((char)iVar7 == '\0') {
            _primCount = (pointer)pTVar1;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&piStack_550);
            std::operator<<((ostream *)&piStack_550,
                            "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                           );
            std::operator<<((ostream *)&piStack_550,"  - case A: program 0, tessellation levels: ");
            (anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels::description_abi_cxx11_
                      (&tessLevelsStr,
                       tessLevelCases.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar15].levels.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            std::operator<<((ostream *)&piStack_550,(string *)&tessLevelsStr);
            std::operator<<((ostream *)&piStack_550,"\n");
            std::operator<<((ostream *)&piStack_550,"  - case B: program ");
            std::ostream::operator<<((ostream *)&piStack_550,(int)lVar16);
            std::operator<<((ostream *)&piStack_550,", tessellation levels: ");
            (anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels::description_abi_cxx11_
                      ((string *)&local_1b0,pTVar3 + lVar14);
            std::operator<<((ostream *)&piStack_550,(string *)&local_1b0);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&primCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&tessLevelsStr);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&piStack_550);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of primitives");
LAB_00419812:
            std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
            ~_Vector_base(&prim0Vertices.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         );
            goto LAB_0041981c;
          }
        }
        std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
        ~_Vector_base(&prim0Vertices.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     );
        std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
        ~_Vector_base(&tfResult.varying.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     );
        lVar16 = lVar16 + 1;
      }
      std::__cxx11::string::~string((string *)&bindings[0].binding.name);
      lVar14 = lVar14 + 1;
      if (lVar16 < lVar13) {
        std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
        ~_Vector_base(&firstPrimVertices.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     );
        goto LAB_00419a4a;
      }
    }
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              (&firstPrimVertices.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

PrimitiveSetInvarianceCase::IterateResult PrimitiveSetInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&					log					= m_testCtx.getLog();
	const RenderContext&		renderCtx			= m_context.getRenderContext();
	const RandomViewport		viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&		gl					= renderCtx.getFunctions();
	const vector<LevelCase>		tessLevelCases		= genTessLevelCases();
	vector<vector<int> >		primitiveCounts;
	int							maxNumPrimitives	= -1;

	for (int caseNdx = 0; caseNdx < (int)tessLevelCases.size(); caseNdx++)
	{
		primitiveCounts.push_back(vector<int>());
		for (int i = 0; i < (int)tessLevelCases[caseNdx].levels.size(); i++)
		{
			const int primCount = referencePrimitiveCount(m_primitiveType, m_spacing, m_usePointMode,
														  &tessLevelCases[caseNdx].levels[i].inner[0], &tessLevelCases[caseNdx].levels[i].outer[0]);
			primitiveCounts.back().push_back(primCount);
			maxNumPrimitives = de::max(maxNumPrimitives, primCount);
		}
	}

	const deUint32				primitiveTypeGL		= outputPrimitiveTypeGL(m_primitiveType, m_usePointMode);
	const TFHandler				transformFeedback	(m_context.getRenderContext(), 2*maxNumPrimitives*numVerticesPerPrimitive(primitiveTypeGL));

	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 7);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const LevelCase&	levelCase = tessLevelCases[tessLevelCaseNdx];
		vector<Vec3>		firstPrimVertices;

		{
			string tessLevelsStr;
			for (int i = 0; i < (int)levelCase.levels.size(); i++)
				tessLevelsStr += (levelCase.levels.size() > 1 ? "\n" : "") + levelCase.levels[i].description();
			log << TestLog::Message << "Tessellation level sets: " << tessLevelsStr << TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < (int)levelCase.levels.size(); subTessLevelCaseNdx++)
		{
			const TessLevels&				tessLevels		= levelCase.levels[subTessLevelCaseNdx];
			const float						(&inner)[2]		= tessLevels.inner;
			const float						(&outer)[4]		= tessLevels.outer;
			const float						attribute[2*7]	= { inner[0], inner[1], outer[0], outer[1], outer[2], outer[3], 0.0f,
																inner[0], inner[1], outer[0], outer[1], outer[2], outer[3], 0.5f };
			const glu::VertexArrayBinding	bindings[]		= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attribute), 0, &attribute[0]) };

			for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
			{
				const deUint32				programGL	= m_programs[programNdx].program->getProgram();
				gl.useProgram(programGL);
				const TFHandler::Result		tfResult	= transformFeedback.renderAndGetPrimitives(programGL, primitiveTypeGL, DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attribute));

				if (tfResult.numPrimitives != 2*primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx])
				{
					log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
											<< tfResult.numPrimitives << ", reference value is " << 2*primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx]
											<< TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
					return STOP;
				}

				{
					const int			half			= (int)tfResult.varying.size()/2;
					const vector<Vec3>	prim0Vertices	= vector<Vec3>(tfResult.varying.begin(), tfResult.varying.begin() + half);
					const Vec3* const	prim1Vertices	= &tfResult.varying[half];

					for (int vtxNdx = 0; vtxNdx < (int)prim0Vertices.size(); vtxNdx++)
					{
						if (prim0Vertices[vtxNdx] != prim1Vertices[vtxNdx])
						{
							log << TestLog::Message << "Failure: tessellation coordinate at index " << vtxNdx << " differs between two primitives drawn in one draw call" << TestLog::EndMessage
								<< TestLog::Message << "Note: the coordinate is " << prim0Vertices[vtxNdx] << " for the first primitive and " << prim1Vertices[vtxNdx] << " for the second" << TestLog::EndMessage
								<< TestLog::Message << "Note: tessellation levels for both primitives were: " << tessellationLevelsString(&inner[0], &outer[0]) << TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
							return STOP;
						}
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrimVertices = prim0Vertices;
					else
					{
						const bool compareOk = compare(firstPrimVertices, prim0Vertices, levelCase.mem);
						if (!compareOk)
						{
							log << TestLog::Message << "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
													<< "  - case A: program 0, tessellation levels: " << tessLevelCases[tessLevelCaseNdx].levels[0].description() << "\n"
													<< "  - case B: program " << programNdx << ", tessellation levels: " << tessLevels.description() << TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}